

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmeta.cpp
# Opt level: O1

vm_meta_entry_t * __thiscall CVmMetaTable::get_entry_by_id(CVmMetaTable *this,char *id)

{
  bool bVar1;
  int iVar2;
  char *__s1;
  char *__s2;
  vm_meta_entry_t *unaff_RBP;
  vm_meta_entry_t *pvVar3;
  ulong uVar4;
  size_t entry_name_len;
  size_t name_len;
  size_t local_40;
  size_t local_38;
  
  __s1 = lib_find_vsn_suffix(id,'/',"000000",&local_38);
  if (this->count_ != 0) {
    pvVar3 = this->table_;
    uVar4 = 0;
    do {
      __s2 = lib_find_vsn_suffix(pvVar3->image_meta_name_,'/',"000000",&local_40);
      bVar1 = true;
      if ((local_38 == local_40) && (iVar2 = bcmp(id,pvVar3->image_meta_name_,local_38), iVar2 == 0)
         ) {
        iVar2 = strcmp(__s1,__s2);
        unaff_RBP = (vm_meta_entry_t *)0x0;
        bVar1 = false;
        if (iVar2 < 1) {
          unaff_RBP = pvVar3;
          bVar1 = false;
        }
      }
      if (!bVar1) {
        return unaff_RBP;
      }
      pvVar3 = pvVar3 + 1;
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->count_);
  }
  return (vm_meta_entry_t *)0x0;
}

Assistant:

vm_meta_entry_t *CVmMetaTable::get_entry_by_id(const char *id) const
{
    /* find the version suffix in the metaclass name, if any */
    size_t name_len;
    const char *vsn = lib_find_vsn_suffix(id, '/', "000000", &name_len);

    /* look up the metaclass by name */
    size_t i;
    vm_meta_entry_t *entry;
    for (i = 0, entry = table_ ; i < count_ ; ++entry, ++i)
    {
        /* find the version number in this entry */
        size_t entry_name_len;
        const char *entry_vsn = lib_find_vsn_suffix(
            entry->image_meta_name_, '/', "000000", &entry_name_len);

        /* see if this is a match */
        if (name_len == entry_name_len
            && memcmp(id, entry->image_meta_name_, name_len) == 0)
        {
            /* 
             *   we found a match to the name; make sure the version is at
             *   least as high as requested 
             */
            if (strcmp(vsn, entry_vsn) <= 0)
            {
                /* the loaded version is at least as new, so return it */
                return entry;
            }
            else
            {
                /* it's too old, so it's effectively not available */
                return 0;
            }
        }
    }

    /* didn't find a match */
    return 0;
}